

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O3

void Diligent::ParseAttributesInComment
               (String *Comment,
               unordered_map<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *Attributes)

{
  byte bVar1;
  size_type sVar2;
  byte *pbVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  Pos;
  byte *pbVar5;
  byte *pbVar6;
  size_type sVar7;
  String Attrib;
  String Value;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  long *local_b8 [2];
  long local_a8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  HashMapStringKey local_78;
  pair<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  local_68.first.Str = (Comment->_M_dataplus)._M_p;
  sVar2 = Comment->_M_string_length;
  pbVar3 = (byte *)local_68.first.Str;
  sVar7 = sVar2;
  if (sVar2 == 0) {
LAB_0038b9b5:
    local_68.first.Str = (Char *)((byte *)local_68.first.Str + sVar2);
    if ((((pbVar3 != (byte *)local_68.first.Str) &&
         ((*pbVar3 == 0x2f && (pbVar3 + 1 != (byte *)local_68.first.Str)))) &&
        ((bVar1 = pbVar3[1], bVar1 == 0x2f || (bVar1 == 0x2a)))) &&
       (local_c0._M_current = (char *)(pbVar3 + 2), local_c0._M_current != local_68.first.Str)) {
      _Var4._M_current = local_c0._M_current;
      do {
        while (((local_68.first.Str != local_c0._M_current &&
                (_Var4._M_current = local_c0._M_current, (ulong)(byte)*local_c0._M_current < 0x21))
               && ((0x100002600U >> ((ulong)(byte)*local_c0._M_current & 0x3f) & 1) != 0))) {
          local_c0._M_current = local_c0._M_current + 1;
          _Var4._M_current = local_68.first.Str;
        }
        if (_Var4._M_current == local_68.first.Str) {
          return;
        }
        local_c0._M_current = _Var4._M_current;
        local_c0 = Parsing::
                   SkipIdentifier<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                             (&local_c0,
                              (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_68);
        local_b8[0] = local_a8;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)local_b8,_Var4._M_current,local_c0._M_current);
        pbVar3 = (byte *)((Comment->_M_dataplus)._M_p + Comment->_M_string_length);
        _Var4._M_current = local_c0._M_current;
        while (((pbVar3 != (byte *)local_c0._M_current &&
                (_Var4._M_current = local_c0._M_current, (ulong)(byte)*local_c0._M_current < 0x21))
               && ((0x100002600U >> ((ulong)(byte)*local_c0._M_current & 0x3f) & 1) != 0))) {
          local_c0._M_current = local_c0._M_current + 1;
          _Var4._M_current = (char *)pbVar3;
        }
        local_c0._M_current = _Var4._M_current;
        if (((byte *)_Var4._M_current == pbVar3) || (*_Var4._M_current != 0x3d)) {
LAB_0038bc5e:
          if (local_b8[0] == local_a8) {
            return;
          }
          operator_delete(local_b8[0],local_a8[0] + 1);
          return;
        }
        pbVar5 = (byte *)_Var4._M_current + 1;
        pbVar6 = pbVar5;
        while (((pbVar3 != pbVar5 && (pbVar6 = pbVar5, (ulong)*pbVar5 < 0x21)) &&
               ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) != 0))) {
          pbVar5 = pbVar5 + 1;
          pbVar6 = pbVar3;
        }
        local_c0._M_current = (char *)pbVar6;
        if (pbVar6 == pbVar3) goto LAB_0038bc5e;
        local_68.first.Str = (Char *)pbVar3;
        local_c0 = Parsing::
                   SkipIdentifier<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                             (&local_c0,
                              (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_68);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_98,pbVar6,local_c0._M_current);
        HashMapStringKey::HashMapStringKey(&local_78,(Char *)local_b8[0],true);
        std::
        pair<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<Diligent::HashMapStringKey,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (&local_68,&local_78,&local_98);
        std::
        _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<std::pair<Diligent::HashMapStringKey,std::__cxx11::string>>
                  ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)Attributes,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.second._M_dataplus._M_p != &local_68.second.field_2) {
          operator_delete(local_68.second._M_dataplus._M_p,
                          local_68.second.field_2._M_allocated_capacity + 1);
        }
        if (((byte *)local_68.first.Str != (byte *)0x0) && ((long)local_68.first.Ownership_Hash < 0)
           ) {
          operator_delete__(local_68.first.Str);
        }
        local_68.first.Str = (Char *)0x0;
        local_68.first.Ownership_Hash = 0;
        if ((local_78.Str != (Char *)0x0) && ((long)local_78.Ownership_Hash < 0)) {
          operator_delete__(local_78.Str);
        }
        pbVar3 = (byte *)((Comment->_M_dataplus)._M_p + Comment->_M_string_length);
        _Var4._M_current = local_c0._M_current;
        while (((pbVar3 != (byte *)_Var4._M_current &&
                (local_c0._M_current = _Var4._M_current, (ulong)(byte)*_Var4._M_current < 0x21)) &&
               ((0x100002600U >> ((ulong)(byte)*_Var4._M_current & 0x3f) & 1) != 0))) {
          _Var4._M_current = _Var4._M_current + 1;
          local_c0._M_current = (char *)pbVar3;
        }
        if (((byte *)local_c0._M_current == pbVar3) ||
           ((*local_c0._M_current != 0x3b && (*local_c0._M_current != 0x2c)))) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          goto LAB_0038bc5e;
        }
        local_c0._M_current = local_c0._M_current + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if (local_b8[0] != local_a8) {
          operator_delete(local_b8[0],local_a8[0] + 1);
        }
        local_68.first.Str = (Comment->_M_dataplus)._M_p + Comment->_M_string_length;
        _Var4._M_current = local_c0._M_current;
      } while (local_c0._M_current != local_68.first.Str);
    }
  }
  else {
    do {
      if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0))
      goto LAB_0038b9b5;
      sVar7 = sVar7 - 1;
      pbVar3 = pbVar3 + 1;
    } while (sVar7 != 0);
  }
  return;
}

Assistant:

void ParseAttributesInComment(const String& Comment, std::unordered_map<HashMapStringKey, String>& Attributes)
{
    auto Pos = Comment.begin();
    //    /* partitioning = fractional_even, outputtopology = triangle_cw */
    // ^
    Pos = SkipDelimiters(Pos, Comment.end());
    if (Pos == Comment.end())
        return;
    //    /* partitioning = fractional_even, outputtopology = triangle_cw */
    //    ^
    if (*Pos != '/')
        return;
    ++Pos;
    //    /* partitioning = fractional_even, outputtopology = triangle_cw */
    //     ^
    //    // partitioning = fractional_even, outputtopology = triangle_cw */
    //     ^
    if (Pos == Comment.end() || (*Pos != '/' && *Pos != '*'))
        return;
    ++Pos;
    while (Pos != Comment.end())
    {
        //    /* partitioning = fractional_even, outputtopology = triangle_cw */
        //      ^
        Pos = SkipDelimiters(Pos, Comment.end());
        if (Pos == Comment.end())
            return;
        //    /* partitioning = fractional_even, outputtopology = triangle_cw */
        //       ^
        auto AttribStart = Pos;
        Pos              = SkipIdentifier(Pos, Comment.end());
        String Attrib(AttribStart, Pos);
        //    /* partitioning = fractional_even, outputtopology = triangle_cw */
        //                   ^
        Pos = SkipDelimiters(Pos, Comment.end());
        if (Pos == Comment.end())
            return;
        //    /* partitioning = fractional_even, outputtopology = triangle_cw */
        //                    ^
        if (*Pos != '=')
            return;
        ++Pos;
        //    /* partitioning = fractional_even, outputtopology = triangle_cw */
        //                     ^
        Pos = SkipDelimiters(Pos, Comment.end());
        if (Pos == Comment.end())
            return;
        //    /* partitioning = fractional_even, outputtopology = triangle_cw */
        //                     ^
        auto ValueStartPos = Pos;
        Pos                = SkipIdentifier(Pos, Comment.end());
        //    /* partitioning = fractional_even , outputtopology = triangle_cw */
        //                                     ^
        String Value(ValueStartPos, Pos);
        Attributes.emplace(make_pair(HashMapStringKey(std::move(Attrib)), Value));

        Pos = SkipDelimiters(Pos, Comment.end());
        if (Pos == Comment.end())
            return;
        //    /* partitioning = fractional_even , outputtopology = triangle_cw */
        //                                      ^
        if (*Pos != ',' && *Pos != ';')
            return;
        ++Pos;
        //    /* partitioning = fractional_even , outputtopology = triangle_cw */
        //                                       ^
    }
}